

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O1

void __thiscall
phosg::Image::blend_blit
          (Image *this,Image *source,ssize_t x,ssize_t y,ssize_t w,ssize_t h,ssize_t sx,ssize_t sy)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  ulong r;
  long lVar4;
  long lVar5;
  ulong g;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long x_00;
  bool bVar11;
  uint64_t sa;
  uint64_t sb;
  uint64_t sg;
  uint64_t sr;
  uint64_t da;
  uint64_t db;
  uint64_t dg;
  uint64_t dr;
  long local_b0;
  uint64_t local_98;
  uint64_t local_90;
  uint64_t local_88;
  uint64_t local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  Image *local_58;
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  
  lVar1 = source->width;
  lVar2 = source->height;
  if (w < 0) {
    w = lVar1;
  }
  if (h < 0) {
    h = lVar2;
  }
  uVar7 = sx >> 0x3f & sx;
  local_68 = x - uVar7;
  lVar10 = 0;
  if (sx < 1) {
    sx = lVar10;
  }
  uVar8 = sy >> 0x3f & sy;
  local_60 = y - uVar8;
  if (sy < 1) {
    sy = lVar10;
  }
  local_70 = 0;
  if (0 < local_68) {
    local_70 = local_68;
  }
  if (-1 < local_68) {
    local_68 = lVar10;
  }
  uVar7 = uVar7 + w + local_68;
  local_68 = sx - local_68;
  local_78 = 0;
  if (0 < local_60) {
    local_78 = local_60;
  }
  if (-1 < local_60) {
    local_60 = lVar10;
  }
  uVar9 = uVar8 + h + local_60;
  local_60 = sy - local_60;
  uVar8 = lVar1 - local_68;
  if ((long)(uVar7 + local_68) <= lVar1) {
    uVar8 = uVar7;
  }
  uVar7 = lVar2 - local_60;
  if ((long)(uVar9 + local_60) <= lVar2) {
    uVar7 = uVar9;
  }
  uVar9 = this->width - local_70;
  if ((long)(uVar8 + local_70) <= this->width) {
    uVar9 = uVar8;
  }
  uVar8 = this->height - local_78;
  if ((long)(uVar7 + local_78) <= this->height) {
    uVar8 = uVar7;
  }
  bVar11 = -1 < (long)(uVar9 | uVar8);
  if ((bVar11) && (0 < (long)uVar8)) {
    local_b0 = 0;
    local_58 = source;
    do {
      if (0 < (long)uVar9 && -1 < (long)uVar8) {
        lVar1 = local_b0 + local_60;
        lVar2 = local_b0 + local_78;
        lVar4 = 1;
        lVar10 = local_68;
        x_00 = local_70;
        do {
          read_pixel(local_58,lVar10,lVar1,&local_80,&local_88,&local_90,&local_98);
          uVar7 = local_98;
          r = local_80;
          g = local_88;
          uVar6 = local_90;
          if (local_98 == this->max_value) {
LAB_0010b1ec:
            write_pixel(this,x_00,lVar2,r,g,uVar6,uVar7);
          }
          else if (local_98 != 0) {
            read_pixel(this,x_00,lVar2,&local_38,&local_40,&local_48,&local_50);
            uVar6 = this->max_value;
            lVar5 = uVar6 - local_98;
            uVar7 = (lVar5 * local_50 + local_98 * local_98) / uVar6;
            r = (local_38 * lVar5 + local_80 * local_98) / uVar6;
            g = (local_40 * lVar5 + local_88 * local_98) / uVar6;
            uVar6 = (local_48 * lVar5 + local_90 * local_98) / uVar6;
            goto LAB_0010b1ec;
          }
          bVar3 = lVar4 < (long)uVar9;
          x_00 = x_00 + 1;
          lVar10 = lVar10 + 1;
          lVar4 = lVar4 + 1;
        } while (bVar11 && bVar3);
      }
      local_b0 = local_b0 + 1;
    } while (bVar11 && local_b0 < (long)uVar8);
  }
  return;
}

Assistant:

void Image::blend_blit(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy) {
  if (w < 0) {
    w = source.get_width();
  }
  if (h < 0) {
    h = source.get_height();
  }

  clamp_blit_dimensions(*this, source, &x, &y, &w, &h, &sx, &sy);

  for (int yy = 0; yy < h; yy++) {
    for (int xx = 0; xx < w; xx++) {
      uint64_t sr, sg, sb, sa;
      source.read_pixel(sx + xx, sy + yy, &sr, &sg, &sb, &sa);
      if (sa == this->max_value) {
        this->write_pixel(x + xx, y + yy, sr, sg, sb, sa);
      } else if (sa != 0x00) {
        uint64_t dr, dg, db, da;
        this->read_pixel(x + xx, y + yy, &dr, &dg, &db, &da);
        this->write_pixel(x + xx, y + yy,
            (sr * sa + dr * (this->max_value - sa)) / this->max_value,
            (sg * sa + dg * (this->max_value - sa)) / this->max_value,
            (sb * sa + db * (this->max_value - sa)) / this->max_value,
            (sa * sa + da * (this->max_value - sa)) / this->max_value);
      }
    }
  }
}